

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O0

char fsnav_init_imu(fsnav_imu *imu)

{
  char cVar1;
  ulong local_20;
  size_t i;
  fsnav_imu *imu_local;
  
  imu->w_valid = '\0';
  imu->f_valid = '\0';
  imu->Tw_valid = '\0';
  imu->Tf_valid = '\0';
  imu->W_valid = '\0';
  imu->t = 0.0;
  for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
    imu->w[local_20] = 0.0;
    imu->f[local_20] = 0.0;
    imu->Tw[local_20] = 0.0;
    imu->Tf[local_20] = 0.0;
    imu->W[local_20] = 0.0;
  }
  imu->g[0] = 0.0;
  imu->g[1] = 0.0;
  imu->g[2] = -(fsnav->imu_const).ge * ((fsnav->imu_const).fg / 2.0 + 1.0);
  cVar1 = fsnav_init_sol(&imu->sol,imu->cfg,imu->cfglength);
  return cVar1 != '\0';
}

Assistant:

char fsnav_init_imu(fsnav_imu* imu)
{
	size_t i;

	// validity flags
	imu-> w_valid = 0;
	imu-> f_valid = 0;
	imu->Tw_valid = 0;
	imu->Tf_valid = 0;
	imu-> W_valid = 0;
	imu->t = 0;
	for (i = 0; i < 3; i++) {
		imu->w [i] = 0; // gyroscopes
		imu->f [i] = 0; // accelerometers
		imu->Tw[i] = 0; // gyroscope temperature
		imu->Tf[i] = 0; // accelerometer temperature
		imu->W [i] = 0; // angular velocity of the local level reference frame
	}
	// default gravity acceleration vector
	imu->g[0] = 0;
	imu->g[1] = 0;
	imu->g[2] = -fsnav->imu_const.ge*(1 + fsnav->imu_const.fg/2); // middle value
	// drop the solution
	if (!fsnav_init_sol(&(imu->sol), imu->cfg, imu->cfglength))
		return 0;

	return 1;
}